

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UObject *objectToAdopt)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003a3d88;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b1268;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  init(this,(EVP_PKEY_CTX *)objectToAdopt);
  this->fType = kObject;
  (this->fValue).fObject = objectToAdopt;
  return;
}

Assistant:

Formattable::Formattable(UObject* objectToAdopt)
{
    init();
    fType = kObject;
    fValue.fObject = objectToAdopt;
}